

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

GlobalPooling3DLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_globalpooling3d(NeuralNetworkLayer *this)

{
  GlobalPooling3DLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x5ba) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x5ba;
    this_00 = (GlobalPooling3DLayerParams *)operator_new(0x18);
    GlobalPooling3DLayerParams::GlobalPooling3DLayerParams(this_00);
    (this->layer_).globalpooling3d_ = this_00;
  }
  return (GlobalPooling3DLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::GlobalPooling3DLayerParams* NeuralNetworkLayer::mutable_globalpooling3d() {
  if (!has_globalpooling3d()) {
    clear_layer();
    set_has_globalpooling3d();
    layer_.globalpooling3d_ = new ::CoreML::Specification::GlobalPooling3DLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.globalPooling3d)
  return layer_.globalpooling3d_;
}